

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper_posix.cpp
# Opt level: O0

void * pstore::memory_mapper::mmap
                 (void *__addr,size_t __len,int __prot,int __flags,int __fd,__off_t __offset)

{
  int err;
  uint uVar1;
  oshandle __fd_00;
  off_t __offset_00;
  void *__p;
  int *piVar2;
  ostream *__os;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000084;
  anon_class_8_1_5f322c24_for__M_tp __d;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  errno_erc local_214;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_210;
  string local_200;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1e0 [2];
  ostringstream local_1c0 [8];
  ostringstream message;
  int last_error;
  void *map_failed;
  void *ptr;
  uint64_t length_local;
  uint64_t offset_local;
  bool write_enabled_local;
  file_handle *file_local;
  
  __d.length._4_4_ = in_register_00000084;
  __d.length._0_4_ = __fd;
  uVar1 = 0;
  if ((__prot & 1U) != 0) {
    uVar1 = 2;
  }
  __fd_00 = pstore::file::file_handle::raw_handle((file_handle *)__len);
  __offset_00 = anon_unknown.dwarf_1c032f::checked_offset(CONCAT44(in_register_0000000c,__flags));
  __p = ::mmap((void *)0x0,__d.length,uVar1 | 1,1,__fd_00,__offset_00);
  if (__p == (void *)0xffffffffffffffff) {
    piVar2 = __errno_location();
    err = *piVar2;
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    __os = std::operator<<((ostream *)local_1c0,"Could not memory map file ");
    pstore::file::file_handle::path_abi_cxx11_(&local_200,(file_handle *)__len);
    _Var3 = quoted(&local_200);
    local_1e0[0]._M_string = _Var3._M_string;
    local_210._8_2_ = _Var3._8_2_;
    local_1e0[0]._M_delim = local_210._M_delim;
    local_1e0[0]._M_escape = local_210._M_escape;
    local_210 = _Var3;
    std::__detail::operator<<(__os,local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    errno_erc::errno_erc(&local_214,err);
    std::__cxx11::ostringstream::str();
    raise<pstore::errno_erc,std::__cxx11::string>(local_214,&local_238);
  }
  std::shared_ptr<void>::
  shared_ptr<void,pstore::memory_mapper::mmap(pstore::file::file_handle&,bool,unsigned_long,unsigned_long)::__0,void>
            ((shared_ptr<void> *)__addr,__p,__d);
  return __addr;
}

Assistant:

std::shared_ptr<void> memory_mapper::mmap (file::file_handle & file, bool const write_enabled,
                                               std::uint64_t const offset,
                                               std::uint64_t const length) {
        void * const ptr = ::mmap (nullptr, // base address
                                   length,
                                   PROT_READ | (write_enabled ? PROT_WRITE : 0), // protection flags
                                   MAP_SHARED, file.raw_handle (), checked_offset (offset));
        void const * const map_failed = MAP_FAILED; // NOLINT
        if (ptr == map_failed) {
            int const last_error = errno;
            std::ostringstream message;
            message << "Could not memory map file " << pstore::quoted (file.path ());
            raise (errno_erc{last_error}, message.str ());
        }

        return std::shared_ptr<void> (ptr, [length] (void * const p) {
            if (::munmap (p, length) == -1) {
                raise (errno_erc{errno}, "munmap");
            }
        });
    }